

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O2

Ray * pbrt::SpawnRayTo(Ray *__return_storage_ptr__,Point3fi pFrom,Normal3f nFrom,Float time,
                      Point3fi pTo,Normal3f nTo)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Point3fi PVar3;
  undefined1 auVar4 [16];
  Interval IVar5;
  Interval IVar6;
  Interval IVar7;
  undefined8 in_XMM0_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [56];
  float fVar12;
  undefined1 auVar13 [16];
  ulong in_XMM3_Qb;
  Point3f PVar14;
  Normal3f n;
  Vector3f w;
  Vector3f w_00;
  Point3<float> local_58;
  undefined8 local_48;
  ulong uStack_40;
  Point3<float> local_38;
  undefined1 auVar10 [64];
  Point3f PVar15;
  
  PVar3.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval> =
       (Point3<pbrt::Interval>)(Point3<pbrt::Interval>)pFrom;
  local_48 = nTo.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  uStack_40 = in_XMM3_Qb;
  Point3<float>::Point3<pbrt::Interval>(&local_58,&pTo.super_Point3<pbrt::Interval>);
  Point3<float>::Point3<pbrt::Interval>(&local_38,&pFrom.super_Point3<pbrt::Interval>);
  auVar8._8_8_ = 0;
  auVar8._0_4_ = local_58.super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = local_58.super_Tuple3<pbrt::Point3,_float>.y;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = local_38.super_Tuple3<pbrt::Point3,_float>.x;
  auVar13._4_4_ = local_38.super_Tuple3<pbrt::Point3,_float>.y;
  auVar2 = vsubps_avx(auVar8,auVar13);
  w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  w.super_Tuple3<pbrt::Vector3,_float>.z =
       local_58.super_Tuple3<pbrt::Point3,_float>.z - local_38.super_Tuple3<pbrt::Point3,_float>.z;
  PVar14 = OffsetRayOrigin(PVar3,nFrom,w);
  IVar7 = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  IVar6 = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  IVar5 = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  fVar12 = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  Point3<float>::Point3<pbrt::Interval>(&local_58,&pTo.super_Point3<pbrt::Interval>);
  auVar9._8_8_ = 0;
  auVar9._0_4_ = local_58.super_Tuple3<pbrt::Point3,_float>.x;
  auVar9._4_4_ = local_58.super_Tuple3<pbrt::Point3,_float>.y;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2 = vsubps_avx(auVar2,auVar9);
  PVar3.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = IVar6;
  PVar3.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = IVar5;
  PVar3.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar7;
  n.super_Tuple3<pbrt::Normal3,_float>.z = nTo.super_Tuple3<pbrt::Normal3,_float>.z;
  n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_48;
  n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_48._4_4_;
  auVar11 = ZEXT856(uStack_40);
  w_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  w_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar12 - local_58.super_Tuple3<pbrt::Point3,_float>.z;
  PVar15 = OffsetRayOrigin(PVar3,n,w_00);
  auVar10._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2 = vsubps_avx(auVar10._0_16_,auVar4);
  uVar1 = vmovlps_avx(auVar4);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z = fVar12;
  uVar1 = vmovlps_avx(auVar2);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z =
       PVar15.super_Tuple3<pbrt::Point3,_float>.z - fVar12;
  __return_storage_ptr__->time = time;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline Ray SpawnRayTo(Point3fi pFrom, Normal3f nFrom, Float time,
                                   Point3fi pTo, Normal3f nTo) {
    Point3f pf = OffsetRayOrigin(pFrom, nFrom, Point3f(pTo) - Point3f(pFrom));
    Point3f pt = OffsetRayOrigin(pTo, nTo, pf - Point3f(pTo));
    return Ray(pf, pt - pf, time);
}